

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

value_type
pugi::impl::anon_unknown_0::utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_counter>
          (size_t data,value_type size,value_type result)

{
  byte bVar1;
  value_type vVar2;
  bool bVar3;
  uint8_t lead;
  value_type vStack_28;
  uint8_t utf8_byte_mask;
  value_type result_local;
  size_t size_local;
  uint8_t *data_local;
  
  vStack_28 = result;
  result_local = size;
  size_local = data;
  while (result_local != 0) {
    bVar1 = *(byte *)size_local;
    if (bVar1 < 0x80) {
      vStack_28 = utf32_counter::low(vStack_28,(uint)bVar1);
      size_local = size_local + 1;
      result_local = result_local - 1;
      if ((size_local & 3) == 0) {
        while( true ) {
          bVar3 = false;
          if (3 < result_local) {
            bVar3 = (*(uint *)size_local & 0x80808080) == 0;
          }
          if (!bVar3) break;
          vVar2 = utf32_counter::low(vStack_28,(uint)*(byte *)size_local);
          vVar2 = utf32_counter::low(vVar2,(uint)*(byte *)(size_local + 1));
          vVar2 = utf32_counter::low(vVar2,(uint)*(byte *)(size_local + 2));
          vStack_28 = utf32_counter::low(vVar2,(uint)*(byte *)(size_local + 3));
          size_local = size_local + 4;
          result_local = result_local - 4;
        }
      }
    }
    else if (((bVar1 - 0xc0 < 0x20) && (1 < result_local)) &&
            ((*(byte *)(size_local + 1) & 0xc0) == 0x80)) {
      vStack_28 = utf32_counter::low(vStack_28,
                                     (bVar1 & 0xffffff3f) << 6 | *(byte *)(size_local + 1) & 0x3f);
      size_local = size_local + 2;
      result_local = result_local - 2;
    }
    else if (((bVar1 - 0xe0 < 0x10) && (2 < result_local)) &&
            (((*(byte *)(size_local + 1) & 0xc0) == 0x80 &&
             ((*(byte *)(size_local + 2) & 0xc0) == 0x80)))) {
      vStack_28 = utf32_counter::low(vStack_28,
                                     (bVar1 & 0xffffff1f) << 0xc |
                                     (*(byte *)(size_local + 1) & 0x3f) << 6 |
                                     *(byte *)(size_local + 2) & 0x3f);
      size_local = size_local + 3;
      result_local = result_local - 3;
    }
    else if (((bVar1 - 0xf0 < 8) && (3 < result_local)) &&
            (((*(byte *)(size_local + 1) & 0xc0) == 0x80 &&
             (((*(byte *)(size_local + 2) & 0xc0) == 0x80 &&
              ((*(byte *)(size_local + 3) & 0xc0) == 0x80)))))) {
      vStack_28 = utf32_counter::high(vStack_28,
                                      (bVar1 & 0xffffff0f) << 0x12 |
                                      (*(byte *)(size_local + 1) & 0x3f) << 0xc |
                                      (*(byte *)(size_local + 2) & 0x3f) << 6 |
                                      *(byte *)(size_local + 3) & 0x3f);
      size_local = size_local + 4;
      result_local = result_local - 4;
    }
    else {
      size_local = size_local + 1;
      result_local = result_local - 1;
    }
  }
  return vStack_28;
}

Assistant:

static inline typename Traits::value_type process(const uint8_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			const uint8_t utf8_byte_mask = 0x3f;

			while (size)
			{
				uint8_t lead = *data;

				// 0xxxxxxx -> U+0000..U+007F
				if (lead < 0x80)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;

					// process aligned single-byte (ascii) blocks
					if ((reinterpret_cast<uintptr_t>(data) & 3) == 0)
					{
						// round-trip through void* to silence 'cast increases required alignment of target type' warnings
						while (size >= 4 && (*static_cast<const uint32_t*>(static_cast<const void*>(data)) & 0x80808080) == 0)
						{
							result = Traits::low(result, data[0]);
							result = Traits::low(result, data[1]);
							result = Traits::low(result, data[2]);
							result = Traits::low(result, data[3]);
							data += 4;
							size -= 4;
						}
					}
				}
				// 110xxxxx -> U+0080..U+07FF
				else if (static_cast<unsigned int>(lead - 0xC0) < 0x20 && size >= 2 && (data[1] & 0xc0) == 0x80)
				{
					result = Traits::low(result, ((lead & ~0xC0) << 6) | (data[1] & utf8_byte_mask));
					data += 2;
					size -= 2;
				}
				// 1110xxxx -> U+0800-U+FFFF
				else if (static_cast<unsigned int>(lead - 0xE0) < 0x10 && size >= 3 && (data[1] & 0xc0) == 0x80 && (data[2] & 0xc0) == 0x80)
				{
					result = Traits::low(result, ((lead & ~0xE0) << 12) | ((data[1] & utf8_byte_mask) << 6) | (data[2] & utf8_byte_mask));
					data += 3;
					size -= 3;
				}
				// 11110xxx -> U+10000..U+10FFFF
				else if (static_cast<unsigned int>(lead - 0xF0) < 0x08 && size >= 4 && (data[1] & 0xc0) == 0x80 && (data[2] & 0xc0) == 0x80 && (data[3] & 0xc0) == 0x80)
				{
					result = Traits::high(result, ((lead & ~0xF0) << 18) | ((data[1] & utf8_byte_mask) << 12) | ((data[2] & utf8_byte_mask) << 6) | (data[3] & utf8_byte_mask));
					data += 4;
					size -= 4;
				}
				// 10xxxxxx or 11111xxx -> invalid
				else
				{
					data += 1;
					size -= 1;
				}
			}

			return result;
		}